

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::DelTradeItem(Character *this,short item)

{
  bool bVar1;
  pointer pCVar2;
  const_iterator local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  short item_local;
  Character *this_local;
  
  it._M_node._6_2_ = item;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                 (&this->trade_inventory);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                   (&this->trade_inventory);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return false;
    }
    pCVar2 = std::_List_iterator<Character_Item>::operator->(&local_28);
    if (pCVar2->id == it._M_node._6_2_) break;
    std::_List_iterator<Character_Item>::operator++(&local_28);
  }
  std::_List_const_iterator<Character_Item>::_List_const_iterator(&local_38,&local_28);
  std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
            (&this->trade_inventory,local_38);
  CheckQuestRules(this);
  return true;
}

Assistant:

bool Character::DelTradeItem(short item)
{
	for (std::list<Character_Item>::iterator it = this->trade_inventory.begin(); it != this->trade_inventory.end(); ++it)
	{
		if (it->id == item)
		{
			this->trade_inventory.erase(it);
			this->CheckQuestRules();
			return true;
		}
	}

	return false;
}